

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void write_features_to_file
               (char *path,_Bool is_test_mode,float *features,int feature_size,int id,
               BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  char *pcVar1;
  FILE *__stream;
  int in_ECX;
  long in_RDX;
  byte in_SIL;
  undefined8 in_RDI;
  uint in_R8D;
  byte in_R9B;
  uint in_stack_00000008;
  uint in_stack_00000010;
  int i;
  FILE *pfile;
  char filename [256];
  int local_134;
  char local_128 [263];
  byte local_21;
  uint local_20;
  int local_1c;
  long local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 != 0) {
    local_21 = in_R9B;
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_RDX;
    pcVar1 = get_feature_file_name(in_R8D);
    snprintf(local_128,0x100,"%s/%s",in_RDI,pcVar1);
    __stream = fopen64(local_128,"a");
    if (__stream != (FILE *)0x0) {
      if ((local_9 & 1) == 0) {
        fprintf(__stream,"%d,%d,%d,%d,%d\n",(ulong)local_20,(ulong)local_21,(ulong)in_stack_00000008
                ,(ulong)in_stack_00000010,local_1c);
      }
      for (local_134 = 0; local_134 < local_1c; local_134 = local_134 + 1) {
        fprintf(__stream,"%.6f",(double)*(float *)(local_18 + (long)local_134 * 4));
        if (local_134 < local_1c + -1) {
          fprintf(__stream,",");
        }
      }
      fprintf(__stream,"\n");
      fclose(__stream);
    }
  }
  return;
}

Assistant:

static void write_features_to_file(const char *const path,
                                   const bool is_test_mode,
                                   const float *features,
                                   const int feature_size, const int id,
                                   const BLOCK_SIZE bsize, const int mi_row,
                                   const int mi_col) {
  if (!WRITE_FEATURE_TO_FILE && !is_test_mode) return;

  char filename[256];
  snprintf(filename, sizeof(filename), "%s/%s", path,
           get_feature_file_name(id));
  FILE *pfile = fopen(filename, "a");
  if (pfile == NULL) return;
  if (!is_test_mode) {
    fprintf(pfile, "%d,%d,%d,%d,%d\n", id, (int)bsize, mi_row, mi_col,
            feature_size);
  }
  for (int i = 0; i < feature_size; ++i) {
    fprintf(pfile, "%.6f", features[i]);
    if (i < feature_size - 1) fprintf(pfile, ",");
  }
  fprintf(pfile, "\n");
  fclose(pfile);
}